

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O3

void event_signal_bolt(game_event_type type,wchar_t proj_type,_Bool drawing,_Bool seen,_Bool beam,
                      wchar_t oy,wchar_t ox,wchar_t y,wchar_t x)

{
  event_handler_entry *peVar1;
  game_event_data local_48;
  
  local_48.point.x = proj_type;
  local_48.bolt.drawing = drawing;
  local_48.bolt.seen = seen;
  local_48.bolt.beam = beam;
  local_48.message.type = oy;
  local_48.bolt.ox = ox;
  local_48.birthstage.n_choices = y;
  local_48.birthstage.initial_choice = x;
  for (peVar1 = event_handlers[type]; peVar1 != (event_handler_entry *)0x0; peVar1 = peVar1->next) {
    (*peVar1->fn)(type,&local_48,peVar1->user);
  }
  return;
}

Assistant:

void event_signal_bolt(game_event_type type,
					   int proj_type,
					   bool drawing,
					   bool seen,
					   bool beam,
					   int oy,
					   int ox,
					   int y,
					   int x)
{
	game_event_data data;
	data.bolt.proj_type = proj_type;
	data.bolt.drawing = drawing;
	data.bolt.seen = seen;
	data.bolt.beam = beam;
	data.bolt.oy = oy;
	data.bolt.ox = ox;
	data.bolt.y = y;
	data.bolt.x = x;

	game_event_dispatch(type, &data);
}